

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_setup_connection(connectdata *conn)

{
  CURLcode result;
  connectdata *conn_local;
  
  conn->field_0x640 = conn->field_0x640 & 0xfd;
  conn_local._4_4_ = smtp_init(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_setup_connection(struct connectdata *conn)
{
  CURLcode result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;

  /* Initialise the SMTP layer */
  result = smtp_init(conn);
  if(result)
    return result;

  return CURLE_OK;
}